

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

void * going_malloc(size_t size)

{
  void *extraout_RAX;
  void *pvVar1;
  
  pvVar1 = malloc(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  going_malloc();
  free((void *)size);
  return extraout_RAX;
}

Assistant:

void *going_malloc(size_t size)
{
	void *ptr = malloc(size);
	if(NULL == ptr){
		log_err("going_malloc failed.");
		exit(-1);
	}
	return ptr;
}